

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.cpp
# Opt level: O1

int main(void)

{
  char *__s;
  bool bVar1;
  InstanceBuilder *this;
  size_t sVar2;
  ostream *poVar3;
  int iVar4;
  Result<vkb::Instance> inst_ret;
  SystemInfo system_info;
  Instance vkb_inst;
  Result<vkb::SystemInfo> system_info_ret;
  InstanceBuilder instance_builder;
  undefined1 local_1e0 [56];
  char local_1a8;
  SystemInfo local_1a0;
  undefined1 local_168 [16];
  VkAllocationCallbacks *local_158;
  PFN_vkGetInstanceProcAddr p_Stack_150;
  PFN_vkGetDeviceProcAddr local_148;
  uint32_t uStack_140;
  uint32_t uStack_13c;
  bool local_138;
  bool bStack_137;
  undefined6 uStack_136;
  undefined1 local_130 [56];
  bool local_f8;
  InstanceBuilder local_f0;
  
  vkb::InstanceBuilder::InstanceBuilder(&local_f0);
  vkb::SystemInfo::get_system_info();
  if (local_f8 == false) {
    (**(code **)(*(long *)(char *)local_130._8_8_ + 0x20))
              ((anon_union_56_2_293c120a_for_Result<vkb::Instance>_1 *)local_1e0,local_130._8_8_,
               local_130._0_4_);
    __s = (char *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x122170);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    if ((VkAllocationCallbacks **)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) !=
        &(((anon_union_56_2_293c120a_for_Result<vkb::Instance>_1 *)local_1e0)->m_value).
         allocation_callbacks) {
      operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_),
                      (ulong)(local_1e0._16_8_ + 1));
    }
    iVar4 = -1;
  }
  else {
    std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
              (&local_1a0.available_layers,
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_130);
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
              (&local_1a0.available_extensions,
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
               (local_130 + 0x18));
    local_1a0.validation_layers_available = (bool)local_130[0x30];
    local_1a0.debug_utils_available = (bool)local_130[0x31];
    local_1a0._50_2_ = local_130._50_2_;
    local_1a0.instance_api_version = local_130._52_4_;
    bVar1 = vkb::SystemInfo::is_layer_available(&local_1a0,"VK_LAYER_LUNARG_api_dump");
    if (bVar1) {
      vkb::InstanceBuilder::enable_layer(&local_f0,"VK_LAYER_LUNARG_api_dump");
    }
    if (local_1a0.validation_layers_available == true) {
      this = vkb::InstanceBuilder::enable_validation_layers(&local_f0,true);
      vkb::InstanceBuilder::use_default_debug_messenger(this);
    }
    bVar1 = vkb::SystemInfo::is_extension_available
                      (&local_1a0,"VK_KHR_get_physical_device_properties2");
    if (bVar1) {
      vkb::InstanceBuilder::enable_extension(&local_f0,"VK_KHR_get_physical_device_properties2");
    }
    vkb::InstanceBuilder::build
              ((Result<vkb::Instance> *)
               &((anon_union_56_2_293c120a_for_Result<vkb::Instance>_1 *)local_1e0)->m_value,
               &local_f0);
    if (local_1a8 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to create Vulkan instance. Error: ",0x29);
      if (local_1a8 == '\x01') {
        __assert_fail("!m_init",
                      "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                      ,0x8c,
                      "std::error_code vkb::Result<vkb::Instance>::error() const [T = vkb::Instance]"
                     );
      }
      (**(code **)(*(long *)local_1e0._8_8_ + 0x20))(local_168,local_1e0._8_8_,local_1e0._0_4_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_168._0_8_,local_168._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((VkInstance)local_168._0_8_ != (VkInstance)&local_158) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_158 + 1));
      }
      iVar4 = -1;
    }
    else {
      local_138 = (bool)local_1e0[0x30];
      bStack_137 = (bool)local_1e0[0x31];
      uStack_136 = local_1e0._50_6_;
      local_148 = (PFN_vkGetDeviceProcAddr)local_1e0._32_8_;
      uStack_140 = local_1e0._40_4_;
      uStack_13c = local_1e0._44_4_;
      local_158 = (VkAllocationCallbacks *)local_1e0._16_8_;
      p_Stack_150 = (PFN_vkGetInstanceProcAddr)local_1e0._24_8_;
      local_168._8_8_ = local_1e0._8_8_;
      vkb::destroy_instance((Instance *)local_168);
      iVar4 = 0;
    }
    if (local_1a0.available_extensions.
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.available_extensions.
                      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.available_extensions.
                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.available_extensions.
                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a0.available_layers.
        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.available_layers.
                      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.available_layers.
                            super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.available_layers.
                            super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  vkb::Result<vkb::SystemInfo>::destroy((Result<vkb::SystemInfo> *)local_130);
  if (local_f0.info.disabled_validation_features.
      super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.info.disabled_validation_features.
                    super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.info.disabled_validation_features.
                          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.info.disabled_validation_features.
                          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.info.enabled_validation_features.
      super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.info.enabled_validation_features.
                    super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.info.enabled_validation_features.
                          super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.info.enabled_validation_features.
                          super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.info.disabled_validation_checks.
      super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.info.disabled_validation_checks.
                    super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.info.disabled_validation_checks.
                          super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.info.disabled_validation_checks.
                          super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.info.pNext_elements.
      super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.info.pNext_elements.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.info.pNext_elements.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.info.pNext_elements.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.info.extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.info.extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.info.extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.info.extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.info.layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.info.layers.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.info.layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.info.layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int main() {
    vkb::InstanceBuilder instance_builder;

    auto system_info_ret = vkb::SystemInfo::get_system_info();
    if (!system_info_ret) {
        std::cerr << system_info_ret.error().message().c_str() << "\n";
        return -1;
    }
    auto system_info = system_info_ret.value();

    // check for a layer
    if (system_info.is_layer_available("VK_LAYER_LUNARG_api_dump")) {
        instance_builder.enable_layer("VK_LAYER_LUNARG_api_dump");
    }

    // of course dedicated variable for validation
    if (system_info.validation_layers_available) {
        instance_builder
            .enable_validation_layers()
            // Validation needs to send errors via a callback, have vk-bootstrap do it
            .use_default_debug_messenger();
    }

    // if you need an instance level extension
    if (system_info.is_extension_available("VK_KHR_get_physical_device_properties2")) {
        instance_builder.enable_extension("VK_KHR_get_physical_device_properties2");
    }

    // Build instance now!
    auto inst_ret = instance_builder.build();
    if (!inst_ret) {
        std::cerr << "Failed to create Vulkan instance. Error: " << inst_ret.error().message() << "\n";
        return -1;
    }
    vkb::Instance vkb_inst = inst_ret.value();

    // fancy app logic

    vkb::destroy_instance(vkb_inst);
    return 0;
}